

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.h
# Opt level: O1

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::~RemotelyControlledSampler
          (RemotelyControlledSampler *this)

{
  ~RemotelyControlledSampler(this);
  operator_delete(this);
  return;
}

Assistant:

~RemotelyControlledSampler() { close(); }